

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O3

RK_U32 mpp_mem_total_now(void)

{
  pthread_mutex_t *__mutex;
  MppMemService *pMVar1;
  RK_U32 RVar2;
  
  pMVar1 = MppMemService::get_inst();
  __mutex = (pthread_mutex_t *)pMVar1->m_lock;
  if (__mutex == (pthread_mutex_t *)0x0) {
    RVar2 = pMVar1->m_total_size;
  }
  else {
    pthread_mutex_lock(__mutex);
    RVar2 = pMVar1->m_total_size;
    pthread_mutex_unlock(__mutex);
  }
  return RVar2;
}

Assistant:

RK_U32 mpp_mem_total_now()
{
    MppMemService *srv = MppMemService::get_inst();
    AutoMutex auto_lock(srv->m_lock);

    return srv->total_now();
}